

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_affinity(void)

{
  int iVar1;
  int *piVar2;
  char *__ptr;
  undefined8 uVar3;
  uv_loop_t *loop;
  bool bVar4;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  size_t __cpu;
  int64_t eval_b;
  int64_t eval_a;
  cpu_set_t cpuset;
  int cpumask_size;
  char *newmask;
  char cpustr [11];
  int cpu;
  int r;
  int i;
  
  cpuset.__bits[0xf]._4_4_ = uv_cpumask_size();
  if (cpuset.__bits[0xf]._4_4_ < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x652,"cpumask_size > 0");
    abort();
  }
  cpustr._3_4_ = cpuset.__bits[0xf]._4_4_;
  memset(&eval_a,0,0x80);
  cpustr._7_4_ = sched_getaffinity(0,0x80,(cpu_set_t *)&eval_a);
  if (cpustr._7_4_ == 0) {
    cpustr[7] = '\0';
    cpustr[8] = '\0';
    cpustr[9] = '\0';
    cpustr[10] = '\0';
  }
  else {
    piVar2 = __errno_location();
    cpustr._7_4_ = *piVar2;
  }
  if ((long)(int)cpustr._7_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x66a,"r","==","0",(long)(int)cpustr._7_4_,"==",0);
    abort();
  }
  cpu = 0;
  do {
    if (cpuset.__bits[0xf]._4_4_ <= cpu) {
LAB_001b198b:
      if ((long)cpuset.__bits[0xf]._4_4_ <= (long)(int)cpustr._3_4_) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x672,"cpu","<","cpumask_size",(long)(int)cpustr._3_4_,"<",
                (long)cpuset.__bits[0xf]._4_4_);
        abort();
      }
      snprintf((char *)((long)&newmask + 1),0xb,"%d",(ulong)(uint)cpustr._3_4_);
      init_process_options("spawn_helper_affinity",exit_cb);
      __ptr = (char *)calloc((long)cpuset.__bits[0xf]._4_4_,1);
      if (__ptr == (char *)0x0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x679,"newmask != NULL");
        abort();
      }
      __ptr[(int)cpustr._3_4_] = '\x01';
      options.cpumask_size = (size_t)cpuset.__bits[0xf]._4_4_;
      options.cpumask = __ptr;
      options.args[2] = (char *)((long)&newmask + 1);
      options.args[3] = "dummy";
      uVar3 = uv_default_loop();
      cpustr._7_4_ = uv_spawn(uVar3,&process,&options);
      if (cpustr._7_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x683,"r == 0");
        abort();
      }
      uVar3 = uv_default_loop();
      cpustr._7_4_ = uv_run(uVar3,0);
      if (cpustr._7_4_ != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x686,"r == 0");
        abort();
      }
      if (exit_cb_called != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x688,"exit_cb_called == 1");
        abort();
      }
      if (close_cb_called != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x689,"close_cb_called == 1");
        abort();
      }
      free(__ptr);
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
                ,0x68d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
        abort();
      }
      uv_library_shutdown();
      return 0;
    }
    if ((ulong)(long)cpu >> 3 < 0x80) {
      bVar4 = (cpuset.__bits[((ulong)(long)cpu >> 6) - 1] & 1L << ((byte)cpu & 0x3f)) != 0;
    }
    else {
      bVar4 = false;
    }
    if (bVar4) {
      cpustr[3] = (undefined1)cpu;
      cpustr[4] = cpu._1_1_;
      cpustr[5] = cpu._2_1_;
      cpustr[6] = cpu._3_1_;
      goto LAB_001b198b;
    }
    cpu = cpu + 1;
  } while( true );
}

Assistant:

TEST_IMPL(spawn_affinity) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int i;
  int r;
  int cpu;
  char cpustr[11];
  char* newmask;
  int cpumask_size;
#if defined(_WIN32)
  DWORD_PTR procmask;
  DWORD_PTR sysmask;
#elif defined(__linux__)
  cpu_set_t cpuset;
#else
  cpuset_t cpuset;
#endif

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  /* find a cpu we can use */
  cpu = cpumask_size;
#ifdef _WIN32
  r = GetProcessAffinityMask(GetCurrentProcess(), &procmask, &sysmask);
  ASSERT_NE(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (procmask & (((DWORD_PTR)1) << i)) {
      cpu = i;
      break;
    }
  }
#else
  CPU_ZERO(&cpuset);
#ifdef __linux__
  r = sched_getaffinity(0, sizeof(cpuset), &cpuset);
  if (r)
    r = errno;
  else
    r = 0;
#else
  r = pthread_getaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
#endif
  ASSERT_EQ(r, 0);
  for (i = 0; i < cpumask_size; ++i) {
    if (CPU_ISSET(i, &cpuset)) {
      cpu = i;
      break;
    }
  }
#endif
  ASSERT_LT(cpu, cpumask_size);
  snprintf(cpustr, sizeof(cpustr), "%d", cpu);

  init_process_options("spawn_helper_affinity", exit_cb);

  /* mask the child to just one cpu */
  newmask = (char*)calloc(cpumask_size, 1);
  ASSERT(newmask != NULL);
  newmask[cpu] = 1;
  options.cpumask_size = (size_t)cpumask_size;
  options.cpumask = newmask;

  /* tell the child which one it should get */
  options.args[2] = cpustr;
  options.args[3] = "dummy"; /* need 4 args for test/run-tests.c dispatch */

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  free(newmask);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}